

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_diag_mask_f32(ggml_compute_params *params,ggml_tensor *dst,float value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *__dest;
  void *__src;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t __n;
  long in_RSI;
  int *in_RDI;
  undefined4 in_XMM0_Da;
  int i;
  int j;
  int k;
  int nz;
  int nr;
  int nc;
  int n;
  bool inplace;
  int n_past;
  int nth;
  int ith;
  ggml_tensor *src0;
  int local_4c;
  int local_48;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar4 = *(long *)(in_RSI + 0x98);
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = *(int *)(in_RSI + 0x54);
  lVar8 = *(long *)(lVar4 + 0xf8);
  lVar9 = *(long *)(in_RSI + 0xf8);
  if (iVar3 < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x11d6,"GGML_ASSERT(%s) failed","n_past >= 0");
  }
  if (lVar8 != lVar9) {
    if (iVar1 == 0) {
      lVar8 = ggml_nelements(in_RSI);
      lVar9 = ggml_nelements(lVar4);
      if (lVar8 != lVar9) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                   ,0x11dc,"GGML_ASSERT(%s) failed","ggml_nelements(dst) == ggml_nelements(src0)");
      }
      uVar10 = ggml_is_contiguous(in_RSI);
      if (((uVar10 & 1) == 0) || (uVar10 = ggml_is_contiguous(lVar4), (uVar10 & 1) == 0)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                   ,0x11dd,"GGML_ASSERT(%s) failed",
                   "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)");
      }
      __dest = *(void **)(in_RSI + 0xf8);
      __src = *(void **)(lVar4 + 0xf8);
      __n = ggml_nbytes(in_RSI);
      memcpy(__dest,__src,__n);
    }
    ggml_barrier((ggml_threadpool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  iVar6 = ggml_nrows(lVar4);
  uVar5 = *(undefined8 *)(lVar4 + 0x10);
  iVar7 = (int)*(undefined8 *)(lVar4 + 0x18);
  iVar6 = iVar6 / iVar7;
  if (*(long *)(in_RSI + 0x30) != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x11ed,"GGML_ASSERT(%s) failed","dst->nb[0] == sizeof(float)");
  }
  if (*(long *)(lVar4 + 0x30) != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x11ee,"GGML_ASSERT(%s) failed","src0->nb[0] == sizeof(float)");
  }
  for (local_44 = 0; local_48 = iVar1, local_44 < iVar6; local_44 = local_44 + 1) {
    for (; local_4c = iVar3, local_48 < iVar7; local_48 = iVar2 + local_48) {
      for (; local_4c < (int)uVar5; local_4c = local_4c + 1) {
        if (iVar3 + local_48 < local_4c) {
          *(undefined4 *)
           (*(long *)(in_RSI + 0xf8) + (long)local_44 * *(long *)(in_RSI + 0x40) +
            (long)local_48 * *(long *)(in_RSI + 0x38) + (long)local_4c * *(long *)(in_RSI + 0x30)) =
               in_XMM0_Da;
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_diag_mask_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const float value) {

    const ggml_tensor * src0 = dst->src[0];

    const int ith = params->ith;
    const int nth = params->nth;

    const int  n_past  = ((int32_t *) dst->op_params)[0];
    const bool inplace = src0->data == dst->data;

    GGML_ASSERT(n_past >= 0);

    if (!inplace) {
        if (ith == 0) {
            // memcpy needs to be synchronized across threads to avoid race conditions.
            // => do it in INIT phase
            GGML_ASSERT(ggml_nelements(dst) == ggml_nelements(src0));
            GGML_ASSERT(ggml_is_contiguous(dst) && ggml_is_contiguous(src0));
            memcpy(
                ((char *)  dst->data),
                ((char *) src0->data),
                ggml_nbytes(dst));
        }
        ggml_barrier(params->threadpool);
    }

    // TODO: handle transposed/permuted matrices

    const int n  = ggml_nrows(src0);
    const int nc = src0->ne[0];
    const int nr = src0->ne[1];
    const int nz = n/nr;

    GGML_ASSERT( dst->nb[0] == sizeof(float));
    GGML_ASSERT(src0->nb[0] == sizeof(float));

    for (int k = 0; k < nz; k++) {
        for (int j = ith; j < nr; j += nth) {
            for (int i = n_past; i < nc; i++) {
                if (i > n_past + j) {
                    *(float *)((char *) dst->data + k*dst->nb[2] + j*dst->nb[1] + i*dst->nb[0]) = value;
                }
            }
        }
    }
}